

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie_test.cc
# Opt level: O0

void large_test(void)

{
  timeval b;
  timeval a;
  timeval b_00;
  timeval a_00;
  timeval b_01;
  timeval a_01;
  timeval b_02;
  timeval a_02;
  timeval b_03;
  timeval a_03;
  timeval b_04;
  timeval a_04;
  timeval b_05;
  timeval a_05;
  timeval b_06;
  timeval a_06;
  timeval b_07;
  timeval a_07;
  timeval b_08;
  timeval a_08;
  timeval b_09;
  timeval a_09;
  timeval b_10;
  timeval a_10;
  timeval b_11;
  timeval a_11;
  timeval b_12;
  timeval a_12;
  timeval b_13;
  timeval a_13;
  timeval b_14;
  timeval a_14;
  timeval a_15;
  timeval b_15;
  timeval a_16;
  hbtrie_result hVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  btree_blk_ops *doc_00;
  void *pvVar5;
  bid_t bVar6;
  size_t sVar7;
  filemgr_open_result fVar8;
  timeval tVar9;
  hbtrie_iterator it;
  filemgr_open_result result;
  uint64_t _offset;
  uint64_t *offset;
  char **key;
  size_t keylen;
  int rr;
  int m;
  int n;
  int k;
  int i;
  hbtrie_result r;
  uint8_t valuebuf [8];
  char body [256];
  char meta [256];
  char dockey [256];
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  uint32_t docsize;
  filemgr_config config;
  docio_object doc;
  hbtrie trie;
  filemgr *file;
  docio_handle dhandle;
  btreeblk_handle bhandle;
  int blocksize;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  docio_object *in_stack_fffffffffffff350;
  uint32_t nodesize;
  hbtrie_iterator *it_00;
  filemgr *in_stack_fffffffffffff358;
  code *handle;
  filemgr *in_stack_fffffffffffff360;
  docio_handle *in_stack_fffffffffffff368;
  int in_stack_fffffffffffff370;
  uint in_stack_fffffffffffff374;
  hbtrie_iterator *in_stack_fffffffffffff378;
  undefined4 in_stack_fffffffffffff380;
  undefined4 in_stack_fffffffffffff384;
  undefined4 in_stack_fffffffffffff388;
  undefined4 uVar10;
  hbtrie_func_readkey *in_stack_fffffffffffff390;
  __time_t local_c50;
  __suseconds_t local_c48;
  __time_t local_c20;
  __suseconds_t local_c18;
  undefined1 in_stack_fffffffffffff457;
  docio_object *in_stack_fffffffffffff458;
  uint64_t in_stack_fffffffffffff460;
  docio_handle *in_stack_fffffffffffff468;
  __time_t local_b58;
  __suseconds_t local_b50;
  __time_t local_b28;
  __suseconds_t local_b20;
  __time_t local_af8;
  __suseconds_t local_af0;
  __time_t local_ac8;
  __suseconds_t local_ac0;
  __time_t local_a98;
  __suseconds_t local_a90;
  __time_t local_a68;
  __suseconds_t local_a60;
  __time_t local_a38;
  __suseconds_t local_a30;
  __time_t local_a08;
  __suseconds_t local_a00;
  __time_t local_9d8;
  __suseconds_t local_9d0;
  __time_t local_9a8;
  __suseconds_t local_9a0;
  __time_t local_978;
  __suseconds_t local_970;
  __time_t local_948;
  __suseconds_t local_940;
  __time_t local_918;
  __suseconds_t local_910;
  err_log_callback *in_stack_fffffffffffff708;
  filemgr_config *in_stack_fffffffffffff710;
  undefined1 in_stack_fffffffffffff718 [16];
  __time_t local_8b8;
  __suseconds_t local_8b0;
  __time_t local_888;
  __suseconds_t local_880;
  int local_83c;
  uint local_838;
  undefined1 local_830 [8];
  char local_828 [256];
  char local_728 [184];
  err_log_callback *in_stack_fffffffffffff990;
  char *in_stack_fffffffffffff998;
  undefined1 in_stack_fffffffffffff9a7;
  filemgr *in_stack_fffffffffffff9a8;
  char local_628 [256];
  undefined1 local_528 [256];
  undefined1 local_428 [256];
  undefined1 local_328 [260];
  uint32_t local_224;
  undefined4 local_220;
  undefined4 local_21c;
  undefined4 local_218;
  undefined4 local_214;
  undefined1 local_210;
  undefined2 local_200;
  ushort local_1c0;
  ushort local_1be;
  uint local_1bc;
  undefined1 *local_1a8;
  undefined1 *local_198;
  undefined1 *local_190;
  hbtrie local_188;
  filemgr *local_118;
  hbtrie_iterator local_110;
  undefined4 local_54;
  __time_t local_50;
  __suseconds_t local_48;
  __time_t local_40;
  __suseconds_t local_38;
  timeval local_30;
  __time_t local_20;
  __suseconds_t local_18;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30.tv_sec = local_10.tv_sec;
  local_30.tv_usec = local_10.tv_usec;
  local_54 = 0x1000;
  docio_object::docio_object(in_stack_fffffffffffff350);
  nodesize = (uint32_t)((ulong)in_stack_fffffffffffff350 >> 0x20);
  pvVar3 = malloc(800000);
  pvVar4 = malloc(800000);
  local_1a8 = local_328;
  local_198 = local_428;
  local_190 = local_528;
  memset(&local_220,0,0x60);
  local_220 = local_54;
  local_21c = 0;
  local_218 = 0;
  local_210 = 8;
  local_214 = 8;
  local_200 = 8;
  printf("filemgr, bcache init .. \n");
  system("rm -rf  hbtrie_testfile");
  get_filemgr_ops();
  fVar8 = filemgr_open(in_stack_fffffffffffff718._8_8_,in_stack_fffffffffffff718._0_8_,
                       in_stack_fffffffffffff710,in_stack_fffffffffffff708);
  local_118 = fVar8.file;
  docio_init(in_stack_fffffffffffff368,in_stack_fffffffffffff360,
             SUB81((ulong)in_stack_fffffffffffff358 >> 0x38,0));
  btreeblk_init((btreeblk_handle *)in_stack_fffffffffffff360,in_stack_fffffffffffff358,nodesize);
  uVar10 = local_54;
  doc_00 = btreeblk_get_ops();
  it_00 = &local_110;
  handle = _readkey_wrap;
  hbtrie_init((hbtrie *)CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
              (int)((ulong)in_stack_fffffffffffff368 >> 0x20),(int)in_stack_fffffffffffff368,
              (int)((ulong)in_stack_fffffffffffff360 >> 0x20),0x1038d0,it_00,
              (btree_blk_ops *)CONCAT44(in_stack_fffffffffffff384,in_stack_fffffffffffff380),
              (void *)CONCAT44(uVar10,in_stack_fffffffffffff388),in_stack_fffffffffffff390);
  local_20 = local_30.tv_sec;
  local_18 = local_30.tv_usec;
  gettimeofday(&local_30,(__timezone_ptr_t)0x0);
  a_16.tv_usec = local_10.tv_usec;
  a_16.tv_sec = local_10.tv_sec;
  b_15.tv_usec = local_30.tv_usec;
  b_15.tv_sec = local_30.tv_sec;
  tVar9 = _utime_gap(a_16,b_15);
  local_888 = tVar9.tv_sec;
  local_40 = local_888;
  local_880 = tVar9.tv_usec;
  local_38 = local_880;
  a_15.tv_usec = local_18;
  a_15.tv_sec = local_20;
  tVar9.tv_usec = local_30.tv_usec;
  tVar9.tv_sec = local_30.tv_sec;
  tVar9 = _utime_gap(a_15,tVar9);
  local_8b8 = tVar9.tv_sec;
  local_50 = local_8b8;
  local_8b0 = tVar9.tv_usec;
  local_48 = local_8b0;
  printf("Time elapsed: total %ld.%06ld , interval %ld.%06ld\n",local_40,local_38,local_8b8,
         local_8b0);
  local_83c = 0;
  do {
    if (0 < local_83c) {
      local_83c = 0;
      do {
        if (0 < local_83c) {
          printf("hbtrie search .. \n");
          local_838 = 0;
          while( true ) {
            if (99999 < (int)local_838) {
              local_20 = local_30.tv_sec;
              local_18 = local_30.tv_usec;
              gettimeofday(&local_30,(__timezone_ptr_t)0x0);
              a_02.tv_usec = local_10.tv_usec;
              a_02.tv_sec = local_10.tv_sec;
              b_02.tv_usec = local_30.tv_usec;
              b_02.tv_sec = local_30.tv_sec;
              tVar9 = _utime_gap(a_02,b_02);
              local_b28 = tVar9.tv_sec;
              local_40 = local_b28;
              local_b20 = tVar9.tv_usec;
              local_38 = local_b20;
              a_01.tv_usec = local_18;
              a_01.tv_sec = local_20;
              b_01.tv_usec = local_30.tv_usec;
              b_01.tv_sec = local_30.tv_sec;
              tVar9 = _utime_gap(a_01,b_01);
              local_b58 = tVar9.tv_sec;
              local_50 = local_b58;
              local_b50 = tVar9.tv_usec;
              local_48 = local_b50;
              printf("Time elapsed: total %ld.%06ld , interval %ld.%06ld\n",local_40,local_38,
                     local_b58,local_b50);
              printf("hbtrie iterator ..\n");
              hbtrie_iterator_init((hbtrie *)handle,it_00,doc_00,0x105fdf);
              local_838 = 0;
              while( true ) {
                if (99999 < (int)local_838) {
                  hbtrie_iterator_free(it_00);
                  local_20 = local_30.tv_sec;
                  local_18 = local_30.tv_usec;
                  gettimeofday(&local_30,(__timezone_ptr_t)0x0);
                  a_00.tv_usec = local_10.tv_usec;
                  a_00.tv_sec = local_10.tv_sec;
                  b_00.tv_usec = local_30.tv_usec;
                  b_00.tv_sec = local_30.tv_sec;
                  tVar9 = _utime_gap(a_00,b_00);
                  local_c20 = tVar9.tv_sec;
                  local_40 = local_c20;
                  local_c18 = tVar9.tv_usec;
                  local_38 = local_c18;
                  a.tv_usec = local_18;
                  a.tv_sec = local_20;
                  b.tv_usec = local_30.tv_usec;
                  b.tv_sec = local_30.tv_sec;
                  tVar9 = _utime_gap(a,b);
                  local_c50 = tVar9.tv_sec;
                  local_50 = local_c50;
                  local_c48 = tVar9.tv_usec;
                  local_48 = local_c48;
                  printf("Time elapsed: total %ld.%06ld , interval %ld.%06ld\n",local_40,local_38,
                         local_c50,local_c48);
                  printf("trie root bid %lu\n",local_188.root_bid);
                  filemgr_close(in_stack_fffffffffffff9a8,(bool)in_stack_fffffffffffff9a7,
                                in_stack_fffffffffffff998,in_stack_fffffffffffff990);
                  filemgr_shutdown();
                  if (large_test::__test_pass == 0) {
                    fprintf(_stderr,"%s FAILED\n","large test");
                  }
                  else {
                    fprintf(_stderr,"%s PASSED\n","large test");
                  }
                  return;
                }
                hVar1 = hbtrie_next(in_stack_fffffffffffff378,
                                    (void *)CONCAT44(in_stack_fffffffffffff374,
                                                     in_stack_fffffffffffff370),
                                    (size_t *)in_stack_fffffffffffff368,in_stack_fffffffffffff360);
                if (hVar1 == HBTRIE_RESULT_FAIL) break;
                btreeblk_end((btreeblk_handle *)handle);
                docio_read_doc(in_stack_fffffffffffff468,in_stack_fffffffffffff460,
                               in_stack_fffffffffffff458,(bool)in_stack_fffffffffffff457);
                local_838 = local_838 + 1;
              }
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                      ,0x166);
              large_test::__test_pass = 0;
              __assert_fail("r != HBTRIE_RESULT_FAIL",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                            ,0x166,"void large_test()");
            }
            in_stack_fffffffffffff360 = *(filemgr **)((long)pvVar3 + (long)(int)local_838 * 8);
            sVar7 = strlen(*(char **)((long)pvVar3 + (long)(int)local_838 * 8));
            hVar1 = hbtrie_find(&local_188,in_stack_fffffffffffff360,(int)sVar7,local_830);
            btreeblk_end((btreeblk_handle *)handle);
            if (hVar1 == HBTRIE_RESULT_FAIL) break;
            if (hVar1 != HBTRIE_RESULT_FAIL) {
              docio_read_doc(in_stack_fffffffffffff468,in_stack_fffffffffffff460,
                             in_stack_fffffffffffff458,(bool)in_stack_fffffffffffff457);
              sprintf(local_728,"me");
              sprintf(local_828,"body2_%3d",(ulong)local_838);
              iVar2 = memcmp(local_1a8,*(void **)((long)pvVar3 + (long)(int)local_838 * 8),
                             (ulong)local_1c0);
              if (iVar2 != 0) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                        ,0x159);
                large_test::__test_pass = 0;
                iVar2 = memcmp(local_1a8,*(void **)((long)pvVar3 + (long)(int)local_838 * 8),
                               (ulong)local_1c0);
                if (iVar2 != 0) {
                  __assert_fail("!memcmp(doc.key, key[i], doc.length.keylen)",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                                ,0x159,"void large_test()");
                }
              }
              iVar2 = memcmp(local_198,local_728,(ulong)local_1be);
              if (iVar2 != 0) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                        ,0x15a);
                large_test::__test_pass = 0;
                iVar2 = memcmp(local_198,local_728,(ulong)local_1be);
                if (iVar2 != 0) {
                  __assert_fail("!memcmp(doc.meta, meta, doc.length.metalen)",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                                ,0x15a,"void large_test()");
                }
              }
              iVar2 = memcmp(local_190,local_828,(ulong)local_1bc);
              if (iVar2 != 0) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                        ,0x15b);
                large_test::__test_pass = 0;
                iVar2 = memcmp(local_190,local_828,(ulong)local_1bc);
                if (iVar2 != 0) {
                  __assert_fail("!memcmp(doc.body, body, doc.length.bodylen)",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                                ,0x15b,"void large_test()");
                }
              }
            }
            local_838 = local_838 + 1;
          }
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                  ,0x151);
          large_test::__test_pass = 0;
          __assert_fail("r != HBTRIE_RESULT_FAIL",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                        ,0x151,"void large_test()");
        }
        printf("doc append .. \n");
        for (local_838 = local_83c * 100000; (int)local_838 < (local_83c + 1) * 100000;
            local_838 = local_838 + 1) {
          sprintf(local_628,"%s",*(undefined8 *)((long)pvVar3 + (long)(int)local_838 * 8));
          sprintf(local_728,"me");
          sprintf(local_828,"body2_%3d",(ulong)local_838);
          local_224 = _set_doc((docio_object *)in_stack_fffffffffffff360,(char *)handle,
                               (char *)it_00,(char *)doc_00);
          if (local_224 == 0) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                    ,0x13a);
            large_test::__test_pass = 0;
            if (local_224 == 0) {
              __assert_fail("docsize != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                            ,0x13a,"void large_test()");
            }
          }
          bVar6 = docio_append_doc((docio_handle *)it_00,(docio_object *)doc_00,'\0','\0');
          *(bid_t *)((long)pvVar4 + (long)(int)local_838 * 8) = bVar6;
        }
        local_20 = local_30.tv_sec;
        local_18 = local_30.tv_usec;
        gettimeofday(&local_30,(__timezone_ptr_t)0x0);
        a_08.tv_usec = local_10.tv_usec;
        a_08.tv_sec = local_10.tv_sec;
        b_08.tv_usec = local_30.tv_usec;
        b_08.tv_sec = local_30.tv_sec;
        tVar9 = _utime_gap(a_08,b_08);
        local_a08 = tVar9.tv_sec;
        local_40 = local_a08;
        local_a00 = tVar9.tv_usec;
        local_38 = local_a00;
        a_07.tv_usec = local_18;
        a_07.tv_sec = local_20;
        b_07.tv_usec = local_30.tv_usec;
        b_07.tv_sec = local_30.tv_sec;
        tVar9 = _utime_gap(a_07,b_07);
        local_a38 = tVar9.tv_sec;
        local_50 = local_a38;
        local_a30 = tVar9.tv_usec;
        local_48 = local_a30;
        printf("Time elapsed: total %ld.%06ld , interval %ld.%06ld\n",local_40,local_38,local_a38,
               local_a30);
        printf("hbtrie update .. \n");
        in_stack_fffffffffffff374 = local_838;
        for (local_838 = local_83c * 100000; (int)local_838 < (local_83c + 1) * 100000;
            local_838 = local_838 + 1) {
          in_stack_fffffffffffff368 = *(docio_handle **)((long)pvVar3 + (long)(int)local_838 * 8);
          strlen(*(char **)((long)pvVar3 + (long)(int)local_838 * 8));
          hbtrie_insert((hbtrie *)in_stack_fffffffffffff360,handle,(int)((ulong)it_00 >> 0x20),
                        doc_00,(void *)0x10573c);
          btreeblk_end((btreeblk_handle *)handle);
        }
        local_20 = local_30.tv_sec;
        local_18 = local_30.tv_usec;
        gettimeofday(&local_30,(__timezone_ptr_t)0x0);
        a_06.tv_usec = local_10.tv_usec;
        a_06.tv_sec = local_10.tv_sec;
        b_06.tv_usec = local_30.tv_usec;
        b_06.tv_sec = local_30.tv_sec;
        tVar9 = _utime_gap(a_06,b_06);
        local_a68 = tVar9.tv_sec;
        local_40 = local_a68;
        local_a60 = tVar9.tv_usec;
        local_38 = local_a60;
        a_05.tv_usec = local_18;
        a_05.tv_sec = local_20;
        b_05.tv_usec = local_30.tv_usec;
        b_05.tv_sec = local_30.tv_sec;
        tVar9 = _utime_gap(a_05,b_05);
        local_a98 = tVar9.tv_sec;
        local_50 = local_a98;
        local_a90 = tVar9.tv_usec;
        local_48 = local_a90;
        printf("Time elapsed: total %ld.%06ld , interval %ld.%06ld\n",local_40,local_38,local_a98,
               local_a90);
        printf("filemgr commit .. \n");
        filemgr_commit(in_stack_fffffffffffff360,SUB81((ulong)handle >> 0x38,0),
                       (err_log_callback *)it_00);
        local_20 = local_30.tv_sec;
        local_18 = local_30.tv_usec;
        gettimeofday(&local_30,(__timezone_ptr_t)0x0);
        a_04.tv_usec = local_10.tv_usec;
        a_04.tv_sec = local_10.tv_sec;
        b_04.tv_usec = local_30.tv_usec;
        b_04.tv_sec = local_30.tv_sec;
        tVar9 = _utime_gap(a_04,b_04);
        local_ac8 = tVar9.tv_sec;
        local_40 = local_ac8;
        local_ac0 = tVar9.tv_usec;
        local_38 = local_ac0;
        a_03.tv_usec = local_18;
        a_03.tv_sec = local_20;
        b_03.tv_usec = local_30.tv_usec;
        b_03.tv_sec = local_30.tv_sec;
        tVar9 = _utime_gap(a_03,b_03);
        local_af8 = tVar9.tv_sec;
        local_50 = local_af8;
        local_af0 = tVar9.tv_usec;
        local_48 = local_af0;
        printf("Time elapsed: total %ld.%06ld , interval %ld.%06ld\n",local_40,local_38,local_af8,
               local_af0);
        local_83c = local_83c + 1;
        in_stack_fffffffffffff370 = local_838;
      } while( true );
    }
    printf("doc append .. \n");
    for (local_838 = local_83c * 100000; (int)local_838 < (local_83c + 1) * 100000;
        local_838 = local_838 + 1) {
      pvVar5 = malloc(9);
      *(void **)((long)pvVar3 + (long)(int)local_838 * 8) = pvVar5;
      _set_random_key((char *)it_00,(int)((ulong)doc_00 >> 0x20));
      sprintf(local_628,"%s",*(undefined8 *)((long)pvVar3 + (long)(int)local_838 * 8));
      sprintf(local_728,"m");
      sprintf(local_828,"body_%3d",(ulong)local_838);
      local_224 = _set_doc((docio_object *)in_stack_fffffffffffff360,(char *)handle,(char *)it_00,
                           (char *)doc_00);
      if (local_224 == 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                ,0x121);
        large_test::__test_pass = 0;
        if (local_224 == 0) {
          __assert_fail("docsize != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                        ,0x121,"void large_test()");
        }
      }
      bVar6 = docio_append_doc((docio_handle *)it_00,(docio_object *)doc_00,'\0','\0');
      *(bid_t *)((long)pvVar4 + (long)(int)local_838 * 8) = bVar6;
    }
    local_20 = local_30.tv_sec;
    local_18 = local_30.tv_usec;
    gettimeofday(&local_30,(__timezone_ptr_t)0x0);
    a_14.tv_usec = local_10.tv_usec;
    a_14.tv_sec = local_10.tv_sec;
    b_14.tv_usec = local_30.tv_usec;
    b_14.tv_sec = local_30.tv_sec;
    tVar9 = _utime_gap(a_14,b_14);
    local_40 = tVar9.tv_sec;
    local_38 = tVar9.tv_usec;
    a_13.tv_usec = local_18;
    a_13.tv_sec = local_20;
    b_13.tv_usec = local_30.tv_usec;
    b_13.tv_sec = local_30.tv_sec;
    tVar9 = _utime_gap(a_13,b_13);
    local_918 = tVar9.tv_sec;
    local_50 = local_918;
    local_910 = tVar9.tv_usec;
    local_48 = local_910;
    printf("Time elapsed: total %ld.%06ld , interval %ld.%06ld\n",local_40,local_38,local_918,
           local_910);
    printf("hbtrie update .. \n");
    for (local_838 = local_83c * 100000; (int)local_838 < (local_83c + 1) * 100000;
        local_838 = local_838 + 1) {
      in_stack_fffffffffffff378 = *(hbtrie_iterator **)((long)pvVar3 + (long)(int)local_838 * 8);
      strlen(*(char **)((long)pvVar3 + (long)(int)local_838 * 8));
      hbtrie_insert((hbtrie *)in_stack_fffffffffffff360,handle,(int)((ulong)it_00 >> 0x20),doc_00,
                    (void *)0x104fca);
      btreeblk_end((btreeblk_handle *)handle);
    }
    local_20 = local_30.tv_sec;
    local_18 = local_30.tv_usec;
    gettimeofday(&local_30,(__timezone_ptr_t)0x0);
    a_12.tv_usec = local_10.tv_usec;
    a_12.tv_sec = local_10.tv_sec;
    b_12.tv_usec = local_30.tv_usec;
    b_12.tv_sec = local_30.tv_sec;
    tVar9 = _utime_gap(a_12,b_12);
    local_948 = tVar9.tv_sec;
    local_40 = local_948;
    local_940 = tVar9.tv_usec;
    local_38 = local_940;
    a_11.tv_usec = local_18;
    a_11.tv_sec = local_20;
    b_11.tv_usec = local_30.tv_usec;
    b_11.tv_sec = local_30.tv_sec;
    tVar9 = _utime_gap(a_11,b_11);
    local_978 = tVar9.tv_sec;
    local_50 = local_978;
    local_970 = tVar9.tv_usec;
    local_48 = local_970;
    printf("Time elapsed: total %ld.%06ld , interval %ld.%06ld\n",local_40,local_38,local_978,
           local_970);
    printf("filemgr commit .. \n");
    filemgr_commit(in_stack_fffffffffffff360,SUB81((ulong)handle >> 0x38,0),
                   (err_log_callback *)it_00);
    local_20 = local_30.tv_sec;
    local_18 = local_30.tv_usec;
    gettimeofday(&local_30,(__timezone_ptr_t)0x0);
    a_10.tv_usec = local_10.tv_usec;
    a_10.tv_sec = local_10.tv_sec;
    b_10.tv_usec = local_30.tv_usec;
    b_10.tv_sec = local_30.tv_sec;
    tVar9 = _utime_gap(a_10,b_10);
    local_9a8 = tVar9.tv_sec;
    local_40 = local_9a8;
    local_9a0 = tVar9.tv_usec;
    local_38 = local_9a0;
    a_09.tv_usec = local_18;
    a_09.tv_sec = local_20;
    b_09.tv_usec = local_30.tv_usec;
    b_09.tv_sec = local_30.tv_sec;
    tVar9 = _utime_gap(a_09,b_09);
    local_9d8 = tVar9.tv_sec;
    local_50 = local_9d8;
    local_9d0 = tVar9.tv_usec;
    local_48 = local_9d0;
    printf("Time elapsed: total %ld.%06ld , interval %ld.%06ld\n",local_40,local_38,local_9d8,
           local_9d0);
    local_83c = local_83c + 1;
  } while( true );
}

Assistant:

void large_test()
{
    TEST_INIT();

    int blocksize = 4096 * 1;
    struct btreeblk_handle bhandle;
    struct docio_handle dhandle;
    struct filemgr *file;
    struct hbtrie trie;
    struct docio_object doc;
    struct filemgr_config config;
    uint32_t docsize;
    char keybuf[256], metabuf[256], bodybuf[256];
    char dockey[256], meta[256], body[256];
    uint8_t valuebuf[8];
    hbtrie_result r;

    int i, k, n=100000, m=1, rr;
    size_t keylen = 8;
    char **key;
    uint64_t *offset;
    uint64_t _offset;

    key = (char **)malloc(sizeof(char*) * n);
    offset = (uint64_t *)malloc(sizeof(uint64_t) * n);

    doc.key = (void*)keybuf;
    doc.meta = (void*)metabuf;
    doc.body = (void*)bodybuf;

    memset(&config, 0, sizeof(config));
    config.blocksize = blocksize;
    config.ncacheblock = 0 * 1024 * 128;
    config.flag = 0;
    config.options = FILEMGR_CREATE;
    config.chunksize = sizeof(uint64_t);
    config.num_wal_shards = 8;

    DBG("filemgr, bcache init .. \n");
    rr = system(SHELL_DEL" hbtrie_testfile");
    (void)rr;
    filemgr_open_result result = filemgr_open((char *) "./hbtrie_testfile",
                                              get_filemgr_ops(), &config, NULL);
    file = result.file;
    docio_init(&dhandle, file, false);
    btreeblk_init(&bhandle, file, blocksize);

    hbtrie_init(&trie, 8, 8, blocksize, BLK_NOT_FOUND,
        (void*)&bhandle, btreeblk_get_ops(), (void*)&dhandle, _readkey_wrap);
    TEST_TIME();

    for (k=0;k<m;++k) {
        DBG("doc append .. \n");
        for (i=(n/m)*k;i<(n/m)*(k+1);++i){
            key[i] = (char *)malloc(keylen+1);
            _set_random_key(key[i], keylen);

            //DBG("%s\n", key[i]);
            sprintf(dockey, "%s", key[i]);
            sprintf(meta, "m");
            sprintf(body, "body_%3d", i);
            docsize = _set_doc(&doc, dockey, meta, body);
            TEST_CHK(docsize != 0);
            offset[i] = docio_append_doc(&dhandle, &doc, 0, 0);
        }
        TEST_TIME();

        DBG("hbtrie update .. \n");
        for (i=(n/m)*k;i<(n/m)*(k+1);++i){
            hbtrie_insert(&trie, (void*)key[i], strlen(key[i]),
                          (void*)&offset[i], (void*)&_offset);
            btreeblk_end(&bhandle);
        }
        TEST_TIME();

        DBG("filemgr commit .. \n");
        filemgr_commit(file, true, NULL);
        TEST_TIME();
    }

    for (k=0;k<m;++k) {
        DBG("doc append .. \n");
        for (i=(n/m)*k;i<(n/m)*(k+1);++i){
            sprintf(dockey, "%s", key[i]);
            sprintf(meta, "me");
            sprintf(body, "body2_%3d", i);
            docsize = _set_doc(&doc, dockey, meta, body);
            TEST_CHK(docsize != 0);
            offset[i] = docio_append_doc(&dhandle, &doc, 0, 0);
        }
        TEST_TIME();

        DBG("hbtrie update .. \n");
        for (i=(n/m)*k;i<(n/m)*(k+1);++i){
            hbtrie_insert(&trie, (void*)key[i], strlen(key[i]),
                          (void*)&offset[i], (void*)&_offset);
            btreeblk_end(&bhandle);
        }
        TEST_TIME();

        DBG("filemgr commit .. \n");
        filemgr_commit(file, true, NULL);
        TEST_TIME();
    }

    DBG("hbtrie search .. \n");
    for (i=0;i<n;++i) {
        //DBG("key %s\n", key[i]);
        r = hbtrie_find(&trie, (void*)key[i], strlen(key[i]), (void*)valuebuf);
        btreeblk_end(&bhandle);
        TEST_CHK(r != HBTRIE_RESULT_FAIL);

        if (r != HBTRIE_RESULT_FAIL) {
            memcpy(&_offset, valuebuf, 8);
            docio_read_doc(&dhandle, _offset, &doc, true);

            sprintf(meta, "me");
            sprintf(body, "body2_%3d", i);
            TEST_CHK(!memcmp(doc.key, key[i], doc.length.keylen));
            TEST_CHK(!memcmp(doc.meta, meta, doc.length.metalen));
            TEST_CHK(!memcmp(doc.body, body, doc.length.bodylen));

        }
    }
    TEST_TIME();

    DBG("hbtrie iterator ..\n");
    struct hbtrie_iterator it;
    hbtrie_iterator_init(&trie, &it, NULL, 0);
    for (i=0;i<n;++i){
        r = hbtrie_next(&it, (void*)keybuf, &keylen, (void*)&_offset);
        TEST_CHK(r != HBTRIE_RESULT_FAIL);
        btreeblk_end(&bhandle);
        docio_read_doc(&dhandle, _offset, &doc, true);
        /*
        keybuf[keylen] = 0;
        DBG("%s\n", keybuf);*/
    }
    hbtrie_iterator_free(&it);


    TEST_TIME();

    DBG("trie root bid %" _F64 "\n", trie.root_bid);

    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    TEST_RESULT("large test");
}